

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

FT_Bool Ins_Goto_CodeRange(TT_ExecContext exc,FT_Int aRange,FT_Long aIP)

{
  FT_Byte *pFVar1;
  long lVar2;
  
  if (aRange - 4U < 0xfffffffd) {
    exc->error = 0x84;
  }
  else {
    pFVar1 = exc->codeRangeTable[aRange - 1U].base;
    if (pFVar1 == (FT_Byte *)0x0) {
      exc->error = 0x8a;
    }
    else {
      lVar2 = exc->codeRangeTable[aRange - 1U].size;
      if (aIP <= lVar2) {
        exc->code = pFVar1;
        exc->codeSize = lVar2;
        exc->IP = aIP;
        exc->curRange = aRange;
        return '\0';
      }
      exc->error = 0x83;
    }
  }
  return '\x01';
}

Assistant:

static FT_Bool
  Ins_Goto_CodeRange( TT_ExecContext  exc,
                      FT_Int          aRange,
                      FT_Long         aIP )
  {
    TT_CodeRange*  range;


    if ( aRange < 1 || aRange > 3 )
    {
      exc->error = FT_THROW( Bad_Argument );
      return FAILURE;
    }

    range = &exc->codeRangeTable[aRange - 1];

    if ( !range->base )     /* invalid coderange */
    {
      exc->error = FT_THROW( Invalid_CodeRange );
      return FAILURE;
    }

    /* NOTE: Because the last instruction of a program may be a CALL */
    /*       which will return to the first byte *after* the code    */
    /*       range, we test for aIP <= Size, instead of aIP < Size.  */

    if ( aIP > range->size )
    {
      exc->error = FT_THROW( Code_Overflow );
      return FAILURE;
    }

    exc->code     = range->base;
    exc->codeSize = range->size;
    exc->IP       = aIP;
    exc->curRange = aRange;

    return SUCCESS;
  }